

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_substrate(SemanticParser *this,SP *in)

{
  undefined1 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 uVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  float fVar6;
  SP SVar7;
  SP mat;
  undefined1 local_120 [40];
  _Rb_tree_node_base *local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string name;
  
  local_120._32_8_ = this;
  std::make_shared<pbrt::SubstrateMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  p_Var5 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  local_f8 = (_Rb_tree_node_base *)(*in_RDX + 8);
  do {
    uVar3 = local_120._32_8_;
    _Var2._M_pi = mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var5 == local_f8) {
      mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((SP *)local_120._32_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = (element_type *)
             mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (((SP *)local_120._32_8_)->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = _Var2._M_pi;
      mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      return (SP)SVar7.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var5 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar4 = std::operator==(&name,"Kd");
    if (bVar4) {
      bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
      if (bVar4) {
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).x
             = 1.0;
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).y
             = 1.0;
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).z
             = 1.0;
        syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)local_120,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      }
      else {
        result = &(mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->kd;
LAB_0013a54d:
        syntactic::ParamSet::getParam3f((ParamSet *)*in_RDX,&result->x,&name);
      }
    }
    else {
      bVar4 = std::operator==(&name,"Ks");
      if (bVar4) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
        if (!bVar4) {
          result = &(mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->ks;
          goto LAB_0013a54d;
        }
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).x
             = 1.0;
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).y
             = 1.0;
        ((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ks).z
             = 1.0;
        syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)local_120,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
      }
      else {
        bVar4 = std::operator==(&name,"uroughness");
        if (bVar4) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
          if (bVar4) {
            (mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            uRoughness = 1.0;
            syntactic::ParamSet::getParamTexture((ParamSet *)(local_e0 + 0x10),(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)local_120,(SP *)in);
            std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&((mat.
                          super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->map_uRoughness).
                        super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_120);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
            puVar1 = local_e0 + 0x10;
LAB_0013a535:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 8));
          }
          else {
            fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
            (mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            uRoughness = fVar6;
          }
        }
        else {
          bVar4 = std::operator==(&name,"vroughness");
          if (bVar4) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
            if (bVar4) {
              (mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              vRoughness = 1.0;
              syntactic::ParamSet::getParamTexture((ParamSet *)local_e0,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)local_120,(SP *)in);
              std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&((mat.
                            super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->map_vRoughness).
                          super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_120);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
              puVar1 = local_e0;
              goto LAB_0013a535;
            }
            fVar6 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
            (mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            vRoughness = fVar6;
          }
          else {
            bVar4 = std::operator==(&name,"remaproughness");
            if (bVar4) {
              bVar4 = syntactic::ParamSet::getParamBool((ParamSet *)*in_RDX,&name,false);
              (mat.super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              remapRoughness = bVar4;
            }
            else {
              bVar4 = std::operator==(&name,"bumpmap");
              if (bVar4) {
                syntactic::ParamSet::getParamTexture((ParamSet *)local_f0,(string *)*in_RDX);
                findOrCreateTexture((SemanticParser *)local_120,(SP *)in);
                std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                          (&((mat.
                              super___shared_ptr<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->map_bump).
                            super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                           (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_120);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8));
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
              }
              else {
                bVar4 = std::operator==(&name,"type");
                if (!bVar4) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&local_70,"un-handled substrate-material parameter \'",&it.first);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_120,&local_70,"\'");
                  std::runtime_error::runtime_error(this_00,(string *)local_120);
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_substrate(pbrt::syntactic::Material::SP in)
  {
    SubstrateMaterial::SP mat = std::make_shared<SubstrateMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name)) {
          mat->uRoughness = 1.f;
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name)) {
          mat->vRoughness = 1.f;
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled substrate-material parameter '"+it.first+"'");
    };
    return mat;
  }